

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O2

WeakMapKeyMap * __thiscall
Js::JavascriptWeakMap::GetWeakMapKeyMapFromKey(JavascriptWeakMap *this,RecyclableObject *key)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  WeakMapKeyMap *pWVar7;
  WeakMapKeyMap *local_20;
  Var weakMapKeyData;
  
  bVar2 = DynamicType::Is(((key->type).ptr)->typeId);
  pTVar6 = (key->type).ptr;
  if (!bVar2) {
    if ((int)pTVar6->typeId < 0x58) {
      if (pTVar6->typeId == TypeIds_HostDispatch) goto LAB_00bcb8d6;
    }
    else {
      BVar3 = RecyclableObject::IsExternal(key);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00bcb92b;
        *puVar5 = 0;
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                ,0x11,
                                "(DynamicType::Is(key->GetTypeId()) || JavascriptOperators::GetTypeId(key) == TypeIds_HostDispatch)"
                                ,
                                "DynamicType::Is(key->GetTypeId()) || JavascriptOperators::GetTypeId(key) == TypeIds_HostDispatch"
                               );
    if (!bVar2) {
LAB_00bcb92b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    pTVar6 = (key->type).ptr;
  }
LAB_00bcb8d6:
  local_20 = (WeakMapKeyMap *)0x0;
  iVar4 = (*(key->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x14])(key,key,7,&local_20,0,
                    (((pTVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                    ptr);
  pWVar7 = (WeakMapKeyMap *)0x0;
  if ((iVar4 != 0) &&
     (pWVar7 = (WeakMapKeyMap *)0x0,
     (WeakMapKeyMap *)
     (((((key->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).undefinedValue.ptr
     != local_20)) {
    pWVar7 = local_20;
  }
  return pWVar7;
}

Assistant:

JavascriptWeakMap::WeakMapKeyMap* JavascriptWeakMap::GetWeakMapKeyMapFromKey(RecyclableObject* key) const
    {
        AssertOrFailFast(DynamicType::Is(key->GetTypeId()) || JavascriptOperators::GetTypeId(key) == TypeIds_HostDispatch);

        Var weakMapKeyData = nullptr;

        if (!key->GetInternalProperty(key, InternalPropertyIds::WeakMapKeyMap, &weakMapKeyData, nullptr, key->GetScriptContext()))
        {
            return nullptr;
        }

        if (key->GetLibrary()->GetUndefined() == weakMapKeyData)
        {
            return nullptr;
        }

        return static_cast<WeakMapKeyMap*>(weakMapKeyData);
    }